

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall
Js::ScriptContext::LogCacheUsage
          (ScriptContext *this,PolymorphicInlineCache *cache,bool isGetter,PropertyId propertyId,
          bool hit,bool collision)

{
  code *pcVar1;
  bool bVar2;
  Recycler *pRVar3;
  BaseDictionary<const_Js::PolymorphicInlineCache_*,_InlineCacheData_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  InlineCacheData *this_01;
  undefined4 *puVar5;
  TrackAllocData local_90;
  InlineCacheData *local_68;
  InlineCacheData *data;
  undefined8 local_58;
  TrackAllocData local_50;
  byte local_22;
  byte local_21;
  PropertyId local_20;
  bool collision_local;
  bool hit_local;
  PropertyId propertyId_local;
  bool isGetter_local;
  PolymorphicInlineCache *cache_local;
  ScriptContext *this_local;
  
  local_22 = collision;
  local_21 = hit;
  local_20 = propertyId;
  hit_local = isGetter;
  _propertyId_local = cache;
  cache_local = (PolymorphicInlineCache *)this;
  if (this->cacheDataMap == (CacheDataMap *)0x0) {
    pRVar3 = this->recycler;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,
               (type_info *)
               &JsUtil::
                BaseDictionary<Js::PolymorphicInlineCache_const*,InlineCacheData*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
               ,0x1983);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_50);
    data = (InlineCacheData *)Memory::Recycler::AllocInlined;
    local_58 = 0;
    this_00 = (BaseDictionary<const_Js::PolymorphicInlineCache_*,_InlineCacheData_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)new<Memory::Recycler>(0x38,pRVar3,0x43c4b0);
    JsUtil::
    BaseDictionary<const_Js::PolymorphicInlineCache_*,_InlineCacheData_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_00,this->recycler,0);
    this->cacheDataMap = this_00;
    BindReference(this,this->cacheDataMap);
  }
  local_68 = (InlineCacheData *)0x0;
  bVar2 = JsUtil::
          BaseDictionary<Js::PolymorphicInlineCache_const*,InlineCacheData*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<Js::PolymorphicInlineCache*>
                    ((BaseDictionary<Js::PolymorphicInlineCache_const*,InlineCacheData*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->cacheDataMap,(PolymorphicInlineCache **)&propertyId_local,&local_68);
  if (!bVar2) {
    pAVar4 = &GeneralAllocator(this)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_90,(type_info *)&InlineCacheData::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
               ,0x198a);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_90);
    this_01 = (InlineCacheData *)new<Memory::ArenaAllocator>(0x14,(ArenaAllocator *)pAVar4,0x3f67b0)
    ;
    InlineCacheData::InlineCacheData(this_01);
    local_68 = this_01;
    JsUtil::
    BaseDictionary<const_Js::PolymorphicInlineCache_*,_InlineCacheData_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Item(this->cacheDataMap,(PolymorphicInlineCache **)&propertyId_local,&local_68);
    local_68->isGetCache = (bool)(hit_local & 1);
    local_68->propertyId = local_20;
  }
  if ((local_68->isGetCache & 1U) != (hit_local & 1U)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x1990,"(data->isGetCache == isGetter)",
                                "data->isGetCache == isGetter");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (local_68->propertyId != local_20) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x1991,"(data->propertyId == propertyId)",
                                "data->propertyId == propertyId");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((local_21 & 1) == 0) {
    local_68->misses = local_68->misses + 1;
  }
  else {
    local_68->hits = local_68->hits + 1;
  }
  if ((local_22 & 1) != 0) {
    local_68->collisions = local_68->collisions + 1;
  }
  return;
}

Assistant:

void ScriptContext::LogCacheUsage(Js::PolymorphicInlineCache *cache, bool isGetter, Js::PropertyId propertyId, bool hit, bool collision)
    {
        if (cacheDataMap == NULL)
        {
            cacheDataMap = RecyclerNew(this->recycler, CacheDataMap, this->recycler);
            BindReference(cacheDataMap);
        }

        InlineCacheData *data = NULL;
        if (!cacheDataMap->TryGetValue(cache, &data))
        {
            data = Anew(GeneralAllocator(), InlineCacheData);
            cacheDataMap->Item(cache, data);
            data->isGetCache = isGetter;
            data->propertyId = propertyId;
        }

        Assert(data->isGetCache == isGetter);
        Assert(data->propertyId == propertyId);

        if (hit)
        {
            data->hits++;
        }
        else
        {
            data->misses++;
        }
        if (collision)
        {
            data->collisions++;
        }
    }